

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QToolBarAreaLayoutItem>::data(QList<QToolBarAreaLayoutItem> *this)

{
  QArrayDataPointer<QToolBarAreaLayoutItem> *this_00;
  QToolBarAreaLayoutItem *pQVar1;
  QArrayDataPointer<QToolBarAreaLayoutItem> *in_RDI;
  
  detach((QList<QToolBarAreaLayoutItem> *)0x6f76dc);
  this_00 = (QArrayDataPointer<QToolBarAreaLayoutItem> *)
            QArrayDataPointer<QToolBarAreaLayoutItem>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QToolBarAreaLayoutItem>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }